

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryRegion.h
# Opt level: O1

void __thiscall
MT32Emu::Synth::readMemoryRegion
          (Synth *this,MemoryRegion *region,Bit32u addr,Bit32u len,Bit8u *data)

{
  ulong __n;
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  
  uVar4 = region->entrySize * region->entries;
  uVar2 = uVar4 + region->startAddr;
  sVar3 = (size_t)(uVar2 - addr);
  if (len + addr <= uVar2) {
    sVar3 = (size_t)len;
  }
  uVar2 = (uint)sVar3;
  if (region->realMemory == (Bit8u *)0x0) {
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        data[uVar4] = 0xff;
        if (uVar4 + 1 < uVar2) {
          data[uVar4 + 1] = (char)region->type;
        }
        uVar4 = uVar4 + 2;
      } while (uVar4 < uVar2);
    }
  }
  else {
    uVar1 = addr - region->startAddr;
    if (uVar1 <= uVar4 - 1) {
      __n = (ulong)(uVar4 - uVar1);
      if (uVar1 + uVar2 <= uVar4) {
        __n = sVar3;
      }
      memcpy(data,region->realMemory + uVar1,__n);
      return;
    }
  }
  return;
}

Assistant:

int offset(Bit32u addr) const {
		return addr - startAddr;
	}